

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

token * libchars::lexer(string *str)

{
  char cVar1;
  uint uVar2;
  token *ptVar3;
  int iVar4;
  token *this;
  ulong uVar5;
  token *ptVar6;
  ulong uVar7;
  size_type sVar8;
  ulong uVar9;
  bool bVar10;
  long *local_68 [2];
  long local_58 [2];
  token *local_48;
  string *local_40;
  token *local_38;
  
  sVar8 = str->_M_string_length;
  ptVar6 = (token *)0x0;
  uVar9 = 0;
  this = (token *)0x0;
  local_48 = (token *)0x0;
  uVar7 = 0;
  local_40 = str;
  do {
    uVar5 = 4;
    if ((uVar7 < sVar8) && (cVar1 = (local_40->_M_dataplus)._M_p[uVar7], cVar1 != '\0')) {
      if (cVar1 == '\"') {
        uVar5 = 2;
      }
      else if (cVar1 == '\\') {
        uVar5 = 3;
      }
      else {
        local_38 = ptVar6;
        iVar4 = isspace((int)cVar1);
        ptVar6 = local_38;
        if (cVar1 == '=') {
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          if (iVar4 == 0) {
            iVar4 = isprint((int)cVar1);
            uVar5 = (ulong)(iVar4 != 0);
            ptVar6 = local_38;
          }
        }
      }
    }
    uVar2 = *(uint *)(lex_transitions + uVar5 * 4 + ((ulong)ptVar6 & 0xffffffff) * 0x14);
    ptVar3 = local_48;
    if ((((uVar2 & 0xc0) != 0) && (uVar9 < uVar7)) && (uVar9 < sVar8)) {
      local_38 = this;
      this = (token *)operator_new(0x90);
      token::token(this,UNKNOWN,-1,0,(char *)0x0);
      this->status = (uint)(((int)ptVar6 - 2U & 0xfffffffd) == 0) << 10 | 0x10;
      this->offset = uVar9;
      this->length = (uVar7 + ((uVar2 >> 7 & 1) != 0)) - uVar9;
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_40);
      std::__cxx11::string::operator=((string *)this,(string *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      ptVar3 = this;
      if (local_38 != (token *)0x0) {
        local_38->next = this;
        ptVar3 = local_48;
      }
    }
    local_48 = ptVar3;
    if ((uVar2 & 0x10) != 0) {
      uVar9 = uVar7;
    }
    sVar8 = local_40->_M_string_length;
    ptVar6 = (token *)(ulong)(uVar2 & 0xf);
    bVar10 = uVar7 < sVar8;
    uVar7 = uVar7 + 1;
  } while (bVar10);
  return local_48;
}

Assistant:

token *lexer(const std::string &str)
    {
        token *t_tail = NULL;
        token *t_head = NULL;
        size_t offset = 0, offset_start = 0;
        uint32_t state = S_WS;
        do {
            char c = (offset < str.length()) ? str.at(offset) : 0;
            lex_inputs x = X_WS;
            if (c == 0)
                x = X_EOL;
            else if (c == '\\')
                x = X_ESC;
            else if (c == '"')
                x = X_Q;
            else if (isspace(c) || c == '=')
                x = X_WS;
            else if (isprint(c))
                x = X_A0;

            uint32_t tr = lex_transitions[state][x];
            if ((tr & (A_PUSH|A_EOTP)) != 0) {
                // character part of existing token
            }
            if ((tr & (A_EOT|A_EOTP)) != 0) {
                // end of token (if not empty)
                if (offset > offset_start && offset_start < str.length()) {
                    token *T = new token;
                    T->status = token::IN_STRING;
                    if (state == S_STR || state == S_E2)
                        T->status |= token::IS_QUOTED;
                    T->offset = offset_start;
                    T->length = offset - offset_start;
                    if (tr & A_EOTP) ++T->length;
                    T->value = str.substr(T->offset,T->length);
                    if (t_head == NULL) {
                        t_head = t_tail = T;
                    }
                    else {
                        t_head->next = T;
                        t_head = T;
                    }
                }
            }
            if ((tr & A_SOT) != 0) {
                // new token
                offset_start = offset;
            }
            state = tr & 0x0f;
        } while (offset++ < str.length());

        return t_tail;
    }